

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O0

long __thiscall
AmsConnection::DeleteNotification
          (AmsConnection *this,AmsAddr *amsAddr,uint32_t hNotify,uint32_t tmms,uint16_t port)

{
  long lVar1;
  uint local_74;
  undefined1 local_70 [8];
  AmsRequest request;
  uint16_t port_local;
  uint32_t tmms_local;
  uint32_t hNotify_local;
  AmsAddr *amsAddr_local;
  AmsConnection *this_local;
  
  request.deadline.__d.__r._6_2_ = port;
  AmsRequest::AmsRequest((AmsRequest *)local_70,amsAddr,port,7,0,(void *)0x0,(uint32_t *)0x0,4);
  local_74 = bhf::ads::htole<unsigned_int>(hNotify);
  Frame::prepend<unsigned_int>((Frame *)local_70,&local_74);
  lVar1 = AdsRequest(this,(AmsRequest *)local_70,tmms);
  AmsRequest::~AmsRequest((AmsRequest *)local_70);
  return lVar1;
}

Assistant:

long AmsConnection::DeleteNotification(const AmsAddr& amsAddr, uint32_t hNotify, uint32_t tmms, uint16_t port)
{
    AmsRequest request {
        amsAddr,
        port, AoEHeader::DEL_DEVICE_NOTIFICATION,
        0, nullptr, nullptr,
        sizeof(hNotify)
    };
    request.frame.prepend(bhf::ads::htole(hNotify));
    return AdsRequest(request, tmms);
}